

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O2

void bmp_mask_get_shift_and_prec(OPJ_UINT32 mask,OPJ_UINT32 *shift,OPJ_UINT32 *prec)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  
  OVar1 = 0;
  if (mask == 0) {
    OVar2 = 0;
  }
  else {
    for (; (mask & 1) == 0; mask = mask >> 1) {
      OVar1 = OVar1 + 1;
    }
    OVar2 = 0;
    for (; (mask & 1) != 0; mask = mask >> 1) {
      OVar2 = OVar2 + 1;
    }
  }
  *shift = OVar1;
  *prec = OVar2;
  return;
}

Assistant:

static void bmp_mask_get_shift_and_prec(OPJ_UINT32 mask, OPJ_UINT32* shift,
                                        OPJ_UINT32* prec)
{
    OPJ_UINT32 l_shift, l_prec;

    l_shift = l_prec = 0U;

    if (mask != 0U) {
        while ((mask & 1U) == 0U) {
            mask >>= 1;
            l_shift++;
        }
        while (mask & 1U) {
            mask >>= 1;
            l_prec++;
        }
    }
    *shift = l_shift;
    *prec = l_prec;
}